

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

void pybind11::detail::enable_buffer_protocol(PyHeapTypeObject *heap_type)

{
  PyHeapTypeObject *heap_type_local;
  
  (heap_type->ht_type).tp_as_buffer = &heap_type->as_buffer;
  (heap_type->as_buffer).bf_getbuffer = pybind11_getbuffer;
  (heap_type->as_buffer).bf_releasebuffer = pybind11_releasebuffer;
  return;
}

Assistant:

inline void enable_buffer_protocol(PyHeapTypeObject *heap_type) {
    heap_type->ht_type.tp_as_buffer = &heap_type->as_buffer;
#if PY_MAJOR_VERSION < 3
    heap_type->ht_type.tp_flags |= Py_TPFLAGS_HAVE_NEWBUFFER;
#endif

    heap_type->as_buffer.bf_getbuffer = pybind11_getbuffer;
    heap_type->as_buffer.bf_releasebuffer = pybind11_releasebuffer;
}